

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Vec_Int_t * Dtc_ManFindCommonCuts(Gia_Man_t *p,Vec_Int_t *vCutsXor,Vec_Int_t *vCutsMaj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  
  piVar6 = vCutsXor->pArray;
  piVar7 = vCutsMaj->pArray;
  iVar2 = vCutsXor->nSize;
  iVar3 = vCutsMaj->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p_00->pArray = piVar4;
  if (((long)iVar2 & 3U) != 0) {
    __assert_fail("Vec_IntSize(vCutsXor) % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x156,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (((long)iVar3 & 3U) != 0) {
    __assert_fail("Vec_IntSize(vCutsMaj) % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x157,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (0 < iVar3 && 0 < iVar2) {
    piVar4 = piVar6 + iVar2;
    piVar1 = piVar7 + iVar3;
    do {
      lVar5 = 0;
      do {
        if (piVar6[lVar5] != piVar7[lVar5]) {
          if (piVar6[lVar5] < piVar7[lVar5]) {
            piVar6 = piVar6 + 4;
          }
          else {
            piVar7 = piVar7 + (ulong)(piVar7[lVar5] < piVar6[lVar5]) * 4;
          }
          goto LAB_005e0836;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar5 = 0;
      do {
        Vec_IntPush(p_00,piVar6[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      Vec_IntPush(p_00,piVar7[3]);
      piVar6 = piVar6 + 4;
      piVar7 = piVar7 + 4;
LAB_005e0836:
    } while ((piVar6 < piVar4) && (piVar7 < piVar1));
    if (0x33333332 < p_00->nSize * -0x33333333 + 0x19999999U) {
      __assert_fail("Vec_IntSize(vFadds) % 5 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x16a,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Dtc_ManFindCommonCuts( Gia_Man_t * p, Vec_Int_t * vCutsXor, Vec_Int_t * vCutsMaj )
{
    int * pCuts0 = Vec_IntArray(vCutsXor);
    int * pCuts1 = Vec_IntArray(vCutsMaj);
    int * pLimit0 = Vec_IntLimit(vCutsXor);
    int * pLimit1 = Vec_IntLimit(vCutsMaj);   int i;
    Vec_Int_t * vFadds = Vec_IntAlloc( 1000 );
    assert( Vec_IntSize(vCutsXor) % 4 == 0 );
    assert( Vec_IntSize(vCutsMaj) % 4 == 0 );
    while ( pCuts0 < pLimit0 && pCuts1 < pLimit1 )
    {
        for ( i = 0; i < 3; i++ )
            if ( pCuts0[i] != pCuts1[i] )
                break;
        if ( i == 3 )
        {
            for ( i = 0; i < 4; i++ )
                Vec_IntPush( vFadds, pCuts0[i] );
            Vec_IntPush( vFadds, pCuts1[3] );
            pCuts0 += 4;
            pCuts1 += 4;
        }
        else if ( pCuts0[i] < pCuts1[i] )
            pCuts0 += 4;
        else if ( pCuts0[i] > pCuts1[i] )
            pCuts1 += 4;
    }
    assert( Vec_IntSize(vFadds) % 5 == 0 );
    return vFadds;
}